

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal128.c
# Opt level: O0

char * decimal128ToString(decimal128 *d128,char *string)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  char *pcVar10;
  int32_t rem;
  int32_t thou;
  char *dotat;
  uint32_t sourar [4];
  uint8_t *u;
  int local_60;
  int32_t e;
  int32_t pre;
  int32_t dpd;
  char *t;
  char *s;
  uint32_t *pu;
  char *c;
  char *cstart;
  int local_28;
  uint32_t comb;
  int32_t exp;
  uint32_t msd;
  char *string_local;
  decimal128 *d128_local;
  
  uVar1 = *(uint *)d128->bytes;
  uVar2 = *(uint *)(d128->bytes + 4);
  uVar3 = *(uint *)(d128->bytes + 8);
  uVar4 = *(uint *)(d128->bytes + 0xc);
  pu = (uint32_t *)string;
  if ((int)uVar4 < 0) {
    pu = (uint32_t *)(string + 1);
    *string = '-';
  }
  uVar6 = uVar4 >> 0x1a & 0x1f;
  comb = COMBMSD[uVar6];
  if (COMBEXP[uVar6] == 3) {
    if (comb == 0) {
      strcpy((char *)pu,"Inf");
      strcpy((char *)((long)pu + 3),"inity");
      return string;
    }
    if ((uVar4 & 0x2000000) != 0) {
      *(undefined1 *)pu = 0x73;
      pu = (uint32_t *)((long)pu + 1);
    }
    strcpy((char *)pu,"NaN");
    pu = (uint32_t *)((long)pu + 3);
    if ((((uVar1 == 0) && (uVar2 == 0)) && (uVar3 == 0)) && ((uVar4 & 0x3ffff) == 0)) {
      return string;
    }
    local_28 = 0;
    comb = 0;
  }
  else {
    local_28 = COMBEXP[uVar6] * 0x1000 + (uVar4 >> 0xe & 0xfff) + -0x1820;
  }
  puVar5 = pu;
  if (comb != 0) {
    *(char *)pu = (char)comb + '0';
    pu = (uint32_t *)((long)pu + 1);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar4 >> 4 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)((uVar4 & 0xf) << 6 | uVar3 >> 0x1a)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar3 >> 0x10 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar3 >> 6 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)((uVar3 & 0x3f) << 4 | uVar2 >> 0x1c)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar2 >> 0x12 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar2 >> 8 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)((uVar2 & 0xff) << 2 | uVar1 >> 0x1e)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar1 >> 0x14 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar1 >> 10 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  lVar9 = (long)(int)((uint)DPD2BIN[(int)(uVar1 & 0x3ff)] << 2);
  pbVar8 = "" + lVar9;
  if (pu == puVar5) {
    if (*pbVar8 != 0) {
      *pu = *(uint32_t *)("" + ((lVar9 + 4) - (long)(int)(uint)*pbVar8));
      pu = (uint32_t *)((long)pu + (long)(int)(uint)*pbVar8);
    }
  }
  else {
    *pu = *(uint32_t *)("" + lVar9 + 1);
    pu = (uint32_t *)((long)pu + 3);
  }
  if (pu == puVar5) {
    *(undefined1 *)pu = 0x30;
    pu = (uint32_t *)((long)pu + 1);
  }
  if (local_28 == 0) {
    *(undefined1 *)pu = 0;
  }
  else {
    u._4_4_ = 0;
    local_60 = ((int)pu - (int)puVar5) + local_28;
    if ((0 < local_28) || (local_60 < -5)) {
      u._4_4_ = local_60 + -1;
      local_60 = 1;
    }
    t = (char *)((long)pu + -1);
    if (local_60 < 1) {
      _pre = (uint32_t *)((long)pu + (1 - (long)local_60));
      *(char *)((long)_pre + 1) = '\0';
      for (; puVar5 <= t; t = t + -1) {
        *(char *)_pre = *t;
        _pre = (uint32_t *)((long)_pre + -1);
      }
      *(undefined1 *)puVar5 = 0x30;
      *(undefined1 *)((long)puVar5 + 1) = 0x2e;
      pu = (uint32_t *)((long)puVar5 + 2);
      for (; local_60 < 0; local_60 = local_60 + 1) {
        *(undefined1 *)pu = 0x30;
        pu = (uint32_t *)((long)pu + 1);
      }
    }
    else {
      if ((uint32_t *)((long)puVar5 + (long)local_60) < pu) {
        _pre = pu;
        for (; (uint32_t *)((long)puVar5 + (long)local_60) <= t; t = t + -1) {
          *(char *)_pre = *t;
          _pre = (uint32_t *)((long)_pre + -1);
        }
        *(char *)_pre = '.';
        pu = (uint32_t *)((long)pu + 1);
      }
      if (u._4_4_ != 0) {
        *(undefined1 *)pu = 0x45;
        pcVar10 = (char *)((long)pu + 2);
        *(undefined1 *)((long)pu + 1) = 0x2b;
        if (u._4_4_ < 0) {
          *(undefined1 *)((long)pu + 1) = 0x2d;
          u._4_4_ = -u._4_4_;
        }
        if (u._4_4_ < 1000) {
          *(undefined4 *)pcVar10 =
               *(undefined4 *)
                ("" + (((long)(u._4_4_ << 2) + 4) - (long)(int)(uint)""[u._4_4_ << 2]));
          pu = (uint32_t *)(pcVar10 + (int)(uint)""[u._4_4_ << 2]);
        }
        else {
          iVar7 = (u._4_4_ >> 3) * 0x419 >> 0x11;
          *pcVar10 = (char)iVar7 + '0';
          *(undefined4 *)((long)pu + 3) =
               *(undefined4 *)("" + (long)((u._4_4_ + iVar7 * -1000) * 4) + 1);
          pu = (uint32_t *)((long)pu + 6);
        }
      }
      *(undefined1 *)pu = 0;
    }
  }
  return string;
}

Assistant:

char * decimal128ToString(const decimal128 *d128, char *string){
  uInt msd;			   /* coefficient MSD */
  Int  exp;			   /* exponent top two bits or full */
  uInt comb;			   /* combination field */
  char *cstart;			   /* coefficient start */
  char *c;			   /* output pointer in string */
  const uInt *pu;		   /* work */
  char *s, *t;			   /* .. (source, target) */
  Int  dpd;			   /* .. */
  Int  pre, e;			   /* .. */
  const uByte *u;		   /* .. */

  uInt sourar[4];		   /* source 128-bit */
  #define sourhi sourar[3]	   /* name the word with the sign */
  #define sourmh sourar[2]	   /* and the mid-high word */
  #define sourml sourar[1]	   /* and the mod-low word */
  #define sourlo sourar[0]	   /* and the lowest word */

  /* load source from storage; this is endian */
  pu=(const uInt *)d128->bytes;	   /* overlay */
  if (DECLITEND) {
    sourlo=pu[0];		   /* directly load the low int */
    sourml=pu[1];		   /* then the mid-low */
    sourmh=pu[2];		   /* then the mid-high */
    sourhi=pu[3];		   /* then the high int */
    }
   else {
    sourhi=pu[0];		   /* directly load the high int */
    sourmh=pu[1];		   /* then the mid-high */
    sourml=pu[2];		   /* then the mid-low */
    sourlo=pu[3];		   /* then the low int */
    }

  c=string;			   /* where result will go */
  if (((Int)sourhi)<0) *c++='-';   /* handle sign */

  comb=(sourhi>>26)&0x1f;	   /* combination field */
  msd=COMBMSD[comb];		   /* decode the combination field */
  exp=COMBEXP[comb];		   /* .. */

  if (exp==3) {
    if (msd==0) {		   /* infinity */
      strcpy(c,	  "Inf");
      strcpy(c+3, "inity");
      return string;		   /* easy */
      }
    if (sourhi&0x02000000) *c++='s'; /* sNaN */
    strcpy(c, "NaN");		   /* complete word */
    c+=3;			   /* step past */
    if (sourlo==0 && sourml==0 && sourmh==0
     && (sourhi&0x0003ffff)==0) return string; /* zero payload */
    /* otherwise drop through to add integer; set correct exp */
    exp=0; msd=0;		   /* setup for following code */
    }
   else exp=(exp<<12)+((sourhi>>14)&0xfff)-DECIMAL128_Bias; /* unbiased */

  /* convert 34 digits of significand to characters */
  cstart=c;			   /* save start of coefficient */
  if (msd) *c++='0'+(char)msd;	   /* non-zero most significant digit */

  /* Now decode the declets.  After extracting each one, it is */
  /* decoded to binary and then to a 4-char sequence by table lookup; */
  /* the 4-chars are a 1-char length (significant digits, except 000 */
  /* has length 0).  This allows us to left-align the first declet */
  /* with non-zero content, then remaining ones are full 3-char */
  /* length.  We use fixed-length memcpys because variable-length */
  /* causes a subroutine call in GCC.  (These are length 4 for speed */
  /* and are safe because the array has an extra terminator byte.) */
  #define dpd2char u=&BIN2CHAR[DPD2BIN[dpd]*4];			  \
		   if (c!=cstart) {memcpy(c, u+1, 4); c+=3;}	  \
		    else if (*u)  {memcpy(c, u+4-*u, 4); c+=*u;}
  dpd=(sourhi>>4)&0x3ff;		     /* declet 1 */
  dpd2char;
  dpd=((sourhi&0xf)<<6) | (sourmh>>26);	     /* declet 2 */
  dpd2char;
  dpd=(sourmh>>16)&0x3ff;		     /* declet 3 */
  dpd2char;
  dpd=(sourmh>>6)&0x3ff;		     /* declet 4 */
  dpd2char;
  dpd=((sourmh&0x3f)<<4) | (sourml>>28);     /* declet 5 */
  dpd2char;
  dpd=(sourml>>18)&0x3ff;		     /* declet 6 */
  dpd2char;
  dpd=(sourml>>8)&0x3ff;		     /* declet 7 */
  dpd2char;
  dpd=((sourml&0xff)<<2) | (sourlo>>30);     /* declet 8 */
  dpd2char;
  dpd=(sourlo>>20)&0x3ff;		     /* declet 9 */
  dpd2char;
  dpd=(sourlo>>10)&0x3ff;		     /* declet 10 */
  dpd2char;
  dpd=(sourlo)&0x3ff;			     /* declet 11 */
  dpd2char;

  if (c==cstart) *c++='0';	   /* all zeros -- make 0 */

  if (exp==0) {			   /* integer or NaN case -- easy */
    *c='\0';			   /* terminate */
    return string;
    }

  /* non-0 exponent */
  e=0;				   /* assume no E */
  pre=c-cstart+exp;
  /* [here, pre-exp is the digits count (==1 for zero)] */
  if (exp>0 || pre<-5) {	   /* need exponential form */
    e=pre-1;			   /* calculate E value */
    pre=1;			   /* assume one digit before '.' */
    } /* exponential form */

  /* modify the coefficient, adding 0s, '.', and E+nn as needed */
  s=c-1;			   /* source (LSD) */
  if (pre>0) {			   /* ddd.ddd (plain), perhaps with E */
    char *dotat=cstart+pre;
    if (dotat<c) {		   /* if embedded dot needed... */
      t=c;				/* target */
      for (; s>=dotat; s--, t--) *t=*s; /* open the gap; leave t at gap */
      *t='.';				/* insert the dot */
      c++;				/* length increased by one */
      }

    /* finally add the E-part, if needed; it will never be 0, and has */
    /* a maximum length of 4 digits */
    if (e!=0) {
      *c++='E';			   /* starts with E */
      *c++='+';			   /* assume positive */
      if (e<0) {
	*(c-1)='-';		   /* oops, need '-' */
	e=-e;			   /* uInt, please */
	}
      if (e<1000) {		   /* 3 (or fewer) digits case */
	u=&BIN2CHAR[e*4];	   /* -> length byte */
	memcpy(c, u+4-*u, 4);	   /* copy fixed 4 characters [is safe] */
	c+=*u;			   /* bump pointer appropriately */
	}
       else {			   /* 4-digits */
	Int thou=((e>>3)*1049)>>17; /* e/1000 */
	Int rem=e-(1000*thou);	    /* e%1000 */
	*c++='0'+(char)thou;
	u=&BIN2CHAR[rem*4];	   /* -> length byte */
	memcpy(c, u+1, 4);	   /* copy fixed 3+1 characters [is safe] */
	c+=3;			   /* bump pointer, always 3 digits */
	}
      }
    *c='\0';			   /* add terminator */
    /*printf("res %s\n", string); */
    return string;
    } /* pre>0 */

  /* -5<=pre<=0: here for plain 0.ddd or 0.000ddd forms (can never have E) */
  t=c+1-pre;
  *(t+1)='\0';				/* can add terminator now */
  for (; s>=cstart; s--, t--) *t=*s;	/* shift whole coefficient right */
  c=cstart;
  *c++='0';				/* always starts with 0. */
  *c++='.';
  for (; pre<0; pre++) *c++='0';	/* add any 0's after '.' */
  /*printf("res %s\n", string); */
  return string;
  }